

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundogroup.cpp
# Opt level: O2

void __thiscall QUndoGroup::addStack(QUndoGroup *this,QUndoStack *stack)

{
  bool bVar1;
  long lVar2;
  QListSpecialMethodsBase<QUndoStack*> *this_00;
  long in_FS_OFFSET;
  parameter_type local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QListSpecialMethodsBase<QUndoStack*> *)(*(long *)&this->field_0x8 + 0x80);
  local_20 = stack;
  bVar1 = QListSpecialMethodsBase<QUndoStack*>::contains<QUndoStack*>(this_00,&local_20);
  if (!bVar1) {
    QList<QUndoStack_*>::append((QList<QUndoStack_*> *)this_00,local_20);
    lVar2 = *(long *)&local_20->field_0x8;
    if (*(QUndoGroup **)(lVar2 + 0xb0) != (QUndoGroup *)0x0) {
      removeStack(*(QUndoGroup **)(lVar2 + 0xb0),local_20);
      lVar2 = *(long *)&local_20->field_0x8;
    }
    *(QUndoGroup **)(lVar2 + 0xb0) = this;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUndoGroup::addStack(QUndoStack *stack)
{
    Q_D(QUndoGroup);

    if (d->stack_list.contains(stack))
        return;
    d->stack_list.append(stack);

    if (QUndoGroup *other = stack->d_func()->group)
        other->removeStack(stack);
    stack->d_func()->group = this;
}